

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseFilters::addTags(TestCaseFilters *this,string *tagPattern)

{
  TagExpressionParser *in_RDI;
  TagExpression exp;
  TagExpression *in_stack_ffffffffffffff68;
  value_type *__x;
  vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffffc8;
  TagParser *in_stack_ffffffffffffffd0;
  value_type local_28;
  
  __x = &local_28;
  TagExpression::TagExpression((TagExpression *)0x1c0d93);
  TagExpressionParser::TagExpressionParser(in_RDI,in_stack_ffffffffffffff68);
  TagParser::parse(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  TagExpressionParser::~TagExpressionParser(in_RDI);
  std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::push_back
            (in_stack_ffffffffffffff80,__x);
  TagExpression::~TagExpression((TagExpression *)0x1c0ddd);
  return;
}

Assistant:

void addTags( std::string const& tagPattern ) {
            TagExpression exp;
            TagExpressionParser( exp ).parse( tagPattern );

            m_tagExpressions.push_back( exp );
        }